

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::PickerPrivate::drawTick(PickerPrivate *this,QRect *r,QPainter *p)

{
  QPen *pQVar1;
  QPen local_28 [8];
  QPen pen;
  QPainter *p_local;
  QRect *r_local;
  PickerPrivate *this_local;
  
  _pen = p;
  QPainter::save();
  QPainter::setRenderHint((RenderHint)_pen,true);
  pQVar1 = (QPen *)QPainter::pen();
  QPen::QPen(local_28,pQVar1);
  QPen::setWidth((int)local_28);
  QPen::setCapStyle((PenCapStyle)local_28);
  QPainter::setPen((QPen *)_pen);
  QPainter::setViewport((QRect *)_pen);
  QPainter::setWindow(_pen,0,0,6,7);
  QPainter::drawLine(_pen,0,4,2,6);
  QPainter::drawLine(_pen,2,6,5,1);
  QPainter::restore();
  QPen::~QPen(local_28);
  return;
}

Assistant:

void
PickerPrivate::drawTick( const QRect & r, QPainter * p )
{
	p->save();

	p->setRenderHint( QPainter::Antialiasing );

	QPen pen = p->pen();
	pen.setWidth( 2 );
	pen.setCapStyle( Qt::RoundCap );
	p->setPen( pen );

	p->setViewport( r );
	p->setWindow( 0, 0, 6, 7 );
	p->drawLine( 0, 4, 2, 6 );
	p->drawLine( 2, 6, 5, 1 );

	p->restore();
}